

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::RunContext::handleExpr
          (RunContext *this,AssertionInfo *info,ITransientExpression *expr,
          AssertionReaction *reaction)

{
  bool negated;
  
  (*((this->m_reporter)._M_t.
     super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
     ._M_t.
     super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
     .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl)->
    _vptr_IStreamingReporter[0xd])();
  negated = SUB41((info->resultDisposition & FalseTest) >> 2,0);
  if (negated == expr->m_result) {
    reportExpr(this,info,ExpressionFailed,expr,negated);
    populateReaction(this,reaction);
    return;
  }
  if (this->m_includeSuccessfulResults != false) {
    reportExpr(this,info,Ok,expr,negated);
    return;
  }
  (*(this->super_IResultCapture)._vptr_IResultCapture[0x15])(this);
  return;
}

Assistant:

void RunContext::handleExpr(
        AssertionInfo const& info,
        ITransientExpression const& expr,
        AssertionReaction& reaction
    ) {
        m_reporter->assertionStarting( info );

        bool negated = isFalseTest( info.resultDisposition );
        bool result = expr.getResult() != negated;

        if( result ) {
            if (!m_includeSuccessfulResults) {
                assertionPassed();
            }
            else {
                reportExpr(info, ResultWas::Ok, &expr, negated);
            }
        }
        else {
            reportExpr(info, ResultWas::ExpressionFailed, &expr, negated );
            populateReaction( reaction );
        }
    }